

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_cs(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 cmpv;
  TCGv_i64 newv;
  int iVar1;
  int b2_00;
  TCGv_i64 addr_00;
  TCGv_i64 pTVar2;
  TCGv_i64 cc;
  TCGv_i64 addr;
  int b2;
  int d2;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_d2,FLD_C_d2);
  b2_00 = get_field1(s,FLD_O_b2,FLD_C_b2);
  addr_00 = get_address(s,0,b2_00,iVar1);
  pTVar2 = o->out;
  cmpv = o->in2;
  newv = o->in1;
  iVar1 = get_mem_index(s);
  tcg_gen_atomic_cmpxchg_i64_s390x
            (tcg_ctx_00,pTVar2,addr_00,cmpv,newv,(long)iVar1,
             (MemOp_conflict)s->insn->data | MO_ALIGN);
  tcg_temp_free_i64(tcg_ctx_00,addr_00);
  pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_setcond_i64_s390x(tcg_ctx_00,TCG_COND_NE,pTVar2,o->in2,o->out);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx_00,tcg_ctx_00->cc_op,pTVar2);
  tcg_temp_free_i64(tcg_ctx_00,pTVar2);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_cs(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int d2 = get_field(s, d2);
    int b2 = get_field(s, b2);
    TCGv_i64 addr, cc;

    /* Note that in1 = R3 (new value) and
       in2 = (zero-extended) R1 (expected value).  */

    addr = get_address(s, 0, b2, d2);
    tcg_gen_atomic_cmpxchg_i64(tcg_ctx, o->out, addr, o->in2, o->in1,
                               get_mem_index(s), s->insn->data | MO_ALIGN);
    tcg_temp_free_i64(tcg_ctx, addr);

    /* Are the memory and expected values (un)equal?  Note that this setcond
       produces the output CC value, thus the NE sense of the test.  */
    cc = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, cc, o->in2, o->out);
    tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cc_op, cc);
    tcg_temp_free_i64(tcg_ctx, cc);
    set_cc_static(s);

    return DISAS_NEXT;
}